

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

void __thiscall FM::OPN::DataSave(OPN *this,OPNData *data)

{
  Channel4 *this_00;
  long lVar1;
  
  OPNBase::DataSave(&this->super_OPNBase,&data->opnbase);
  data->fnum[2] = this->fnum[2];
  *(undefined8 *)data->fnum = *(undefined8 *)this->fnum;
  *(undefined8 *)data->fnum3 = *(undefined8 *)this->fnum3;
  data->fnum3[2] = this->fnum3[2];
  *(undefined4 *)data->fnum2 = *(undefined4 *)this->fnum2;
  *(undefined2 *)(data->fnum2 + 4) = *(undefined2 *)(this->fnum2 + 4);
  this_00 = (Channel4 *)&this->field_0x1d8;
  lVar1 = 0;
  do {
    Channel4::DataSave(this_00,(Channel4Data *)((long)data->ch[0].buf + lVar1 + -4));
    lVar1 = lVar1 + 0x238;
    this_00 = this_00 + 1;
  } while (lVar1 != 0x6a8);
  return;
}

Assistant:

void OPN::DataSave(struct OPNData* data) {
	OPNBase::DataSave(&data->opnbase);
	memcpy(data->fnum, fnum, sizeof(uint) * 3);
	memcpy(data->fnum3, fnum3, sizeof(uint) * 3);
	memcpy(data->fnum2, fnum2, 6);
	for(int i = 0; i < 3; i++) {
		ch[i].DataSave(&data->ch[i]);
	}
}